

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.cpp
# Opt level: O2

vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> * __thiscall
myvk::BufferBase::GetSrcMemoryBarriers
          (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
           *__return_storage_ptr__,BufferBase *this,
          vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,uint32_t src_queue_family,
          uint32_t dst_queue_family)

{
  ulong uVar1;
  pointer pVVar2;
  pointer pVVar3;
  VkBuffer pVVar4;
  VkDeviceSize VVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  VkDeviceSize VVar9;
  VkDeviceSize VVar10;
  allocator_type local_41;
  BufferBase *local_40;
  
  local_40 = this;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            (__return_storage_ptr__,
             ((long)(regions->
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(regions->
                   super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x38,&local_41);
  pVVar2 = (regions->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(regions->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x38;
  pVVar3 = (__return_storage_ptr__->
           super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar1 = uVar6 - 1;
  pVVar4 = local_40->m_buffer;
  VVar5 = local_40->m_size;
  uVar7 = 0;
  while (uVar7 < uVar6) {
    pVVar3[uVar7].sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
    if (uVar1 == uVar7) {
      VVar9 = pVVar2[uVar1].bufferOffset;
      VVar10 = VVar5 - VVar9;
      uVar8 = (ulong)((int)uVar7 + 1);
    }
    else {
      uVar8 = (ulong)((int)uVar7 + 1);
      VVar9 = pVVar2[uVar7].bufferOffset;
      VVar10 = pVVar2[uVar8].bufferOffset - VVar9;
    }
    pVVar3[uVar7].size = VVar10;
    pVVar3[uVar7].buffer = pVVar4;
    pVVar3[uVar7].offset = VVar9;
    pVVar3[uVar7].srcAccessMask = src_access_mask;
    pVVar3[uVar7].dstAccessMask = dst_access_mask;
    pVVar3[uVar7].srcQueueFamilyIndex = src_queue_family;
    pVVar3[uVar7].dstQueueFamilyIndex = dst_queue_family;
    uVar7 = uVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkBufferMemoryBarrier> BufferBase::GetSrcMemoryBarriers(const std::vector<VkBufferImageCopy> &regions,
                                                                    VkAccessFlags src_access_mask,
                                                                    VkAccessFlags dst_access_mask,
                                                                    uint32_t src_queue_family,
                                                                    uint32_t dst_queue_family) const {
	std::vector<VkBufferMemoryBarrier> barriers(regions.size());
	for (uint32_t i = 0; i < regions.size(); i++) {
		VkBufferMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
		cur.size = (i == regions.size() - 1) ? m_size - regions[i].bufferOffset
		                                     : regions[i + 1].bufferOffset - regions[i].bufferOffset;

		cur.buffer = m_buffer;
		cur.offset = regions[i].bufferOffset;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;

		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
	}
	return barriers;
}